

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_create_opaq(ly_ctx *ctx,char *name,size_t name_len,char *prefix,size_t pref_len,
                      char *module_key,size_t module_key_len,char *value,size_t value_len,
                      ly_bool *dynamic,LY_VALUE_FORMAT format,void *val_prefix_data,uint32_t hints,
                      lyd_node **node)

{
  LY_ERR LVar1;
  lyd_node *node_00;
  
  if ((((ctx == (ly_ctx *)0x0) || (name == (char *)0x0)) || (name_len == 0)) ||
     (format == LY_VALUE_CANON)) {
    __assert_fail("ctx && name && name_len && format",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x1b2,
                  "LY_ERR lyd_create_opaq(const struct ly_ctx *, const char *, size_t, const char *, size_t, const char *, size_t, const char *, size_t, ly_bool *, LY_VALUE_FORMAT, void *, uint32_t, struct lyd_node **)"
                 );
  }
  if ((value_len == 0) && ((dynamic == (ly_bool *)0x0 || (*dynamic == '\0')))) {
    value = "";
  }
  node_00 = (lyd_node *)calloc(1,0x80);
  if (node_00 == (lyd_node *)0x0) {
    LVar1 = LY_EMEM;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_create_opaq");
  }
  else {
    node_00->prev = node_00;
    LVar1 = lydict_insert(ctx,name,name_len,(char **)&node_00[1].schema);
    if (((LVar1 == LY_SUCCESS) &&
        ((pref_len == 0 ||
         (LVar1 = lydict_insert(ctx,prefix,pref_len,(char **)&node_00[1].parent),
         LVar1 == LY_SUCCESS)))) &&
       ((module_key_len == 0 ||
        (LVar1 = lydict_insert(ctx,module_key,module_key_len,(char **)&node_00[1].next),
        LVar1 == LY_SUCCESS)))) {
      if ((dynamic == (ly_bool *)0x0) || (*dynamic == '\0')) {
        LVar1 = lydict_insert(ctx,value,value_len,(char **)&node_00[1].prev);
        if (LVar1 == LY_SUCCESS) goto LAB_0012ad8f;
      }
      else {
        LVar1 = lydict_insert_zc(ctx,value,(char **)&node_00[1].prev);
        if (LVar1 == LY_SUCCESS) {
          *dynamic = '\0';
LAB_0012ad8f:
          *(LY_VALUE_FORMAT *)((long)&node_00[1].meta + 4) = format;
          node_00[1].priv = val_prefix_data;
          *(uint32_t *)&node_00[1].meta = hints;
          node_00[2].schema = (lysc_node *)ctx;
          *node = node_00;
          return LY_SUCCESS;
        }
      }
    }
  }
  lyd_free_tree(node_00);
  ly_free_prefix_data(format,val_prefix_data);
  return LVar1;
}

Assistant:

LY_ERR
lyd_create_opaq(const struct ly_ctx *ctx, const char *name, size_t name_len, const char *prefix, size_t pref_len,
        const char *module_key, size_t module_key_len, const char *value, size_t value_len, ly_bool *dynamic,
        LY_VALUE_FORMAT format, void *val_prefix_data, uint32_t hints, struct lyd_node **node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_node_opaq *opaq;

    assert(ctx && name && name_len && format);

    if (!value_len && (!dynamic || !*dynamic)) {
        value = "";
    }

    opaq = calloc(1, sizeof *opaq);
    LY_CHECK_ERR_GOTO(!opaq, LOGMEM(ctx); ret = LY_EMEM, finish);

    opaq->prev = &opaq->node;
    LY_CHECK_GOTO(ret = lydict_insert(ctx, name, name_len, &opaq->name.name), finish);

    if (pref_len) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, prefix, pref_len, &opaq->name.prefix), finish);
    }
    if (module_key_len) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, module_key, module_key_len, &opaq->name.module_ns), finish);
    }
    if (dynamic && *dynamic) {
        LY_CHECK_GOTO(ret = lydict_insert_zc(ctx, (char *)value, &opaq->value), finish);
        *dynamic = 0;
    } else {
        LY_CHECK_GOTO(ret = lydict_insert(ctx, value, value_len, &opaq->value), finish);
    }

    opaq->format = format;
    opaq->val_prefix_data = val_prefix_data;
    opaq->hints = hints;
    opaq->ctx = ctx;

finish:
    if (ret) {
        lyd_free_tree(&opaq->node);
        ly_free_prefix_data(format, val_prefix_data);
    } else {
        *node = &opaq->node;
    }
    return ret;
}